

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsplit.hpp
# Opt level: O2

void __thiscall
ncursespp::
vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
::resize_impl<0ul,1ul,2ul>
          (vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
           *this,undefined8 param_2,undefined8 param_3)

{
  int space;
  int xpos;
  int idx;
  array<int,_3UL> widths;
  anon_class_24_3_3cf6bd8b apply_calc;
  anon_class_40_5_85981cb9 apply_resize;
  int local_9c [3];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 *local_70;
  int *local_68;
  int *local_60;
  undefined8 *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  undefined8 *local_38;
  
  local_78 = 0;
  local_80 = 0;
  local_9c[2] = 0;
  local_9c[0] = (int)param_3 - (int)param_2;
  local_60 = local_9c;
  local_90 = param_2;
  local_88 = param_3;
  local_70 = &local_80;
  local_68 = local_9c + 2;
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&local_70,
             (fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>
              *)(this + 0x10));
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&local_70,(fixed_impl<1,_ncursespp::color_rect> *)(this + 8));
  *(undefined4 *)((long)local_70 + (long)*local_68 * 4) = 0xffffffff;
  *local_68 = *local_68 + 1;
  local_9c[2] = 0;
  local_40 = local_9c + 1;
  local_9c[1] = 0;
  local_48 = local_9c;
  local_38 = &local_90;
  local_58 = &local_80;
  local_50 = local_9c + 2;
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#2}::operator()
            ((_lambda_auto_1___2_ *)&local_58,
             (fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>
              *)(this + 0x10));
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#2}::operator()
            ((_lambda_auto_1___2_ *)&local_58,(fixed_impl<1,_ncursespp::color_rect> *)(this + 8));
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#2}::operator()
            ((_lambda_auto_1___2_ *)&local_58,(fill_impl<ncursespp::text> *)this);
  return;
}

Assistant:

void resize_impl(rect_i size, std::index_sequence<I...>)
    {
        std::array<int, count> widths {};
        int idx = 0;
        auto space = size.width();

        // query size_calculator<>::calc for every constraint_t in Splits
        // calc will decrement space when the size is known
        auto apply_calc = [&](auto& S) {
            using SplitType = std::decay_t<decltype(S)>;
            widths[idx] = SplitType::calc(space);
            idx ++;
        };

        (apply_calc(std::get<I>(splits)), ...);

        idx = 0;
        int xpos = 0;
        auto apply_resize = [&](auto& S) {
            if (widths[idx] == -1 && space > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + space, size.right_bottom.y}};
                xpos += space;
                space = 0;
                S.resize(r);
            } else if (widths[idx] > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + widths[idx] - 1, size.right_bottom.y}};
                xpos += widths[idx];
                S.resize(r);
            }

            idx ++;
        };

        (apply_resize(std::get<I>(splits)), ...);
    }